

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_app.cpp
# Opt level: O1

void unariesFromLabelling(int *inputLabelling,float *outputUnary,int W,int H,int dim)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  uVar2 = (ulong)(uint)dim;
  dVar6 = log(1.0 / (double)dim);
  dVar7 = log(0.30000001192092896 / (double)(dim + -1));
  if (0 < W * H) {
    uVar3 = 0;
    pfVar4 = outputUnary;
    do {
      iVar1 = inputLabelling[uVar3];
      if ((long)iVar1 < 0) {
        if (0 < dim) {
          uVar5 = 0;
          do {
            pfVar4[uVar5] = (float)dVar6;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
      }
      else {
        if (0 < dim) {
          uVar5 = 0;
          do {
            pfVar4[uVar5] = (float)dVar7;
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
        }
        outputUnary[uVar3 * (long)dim + (long)iVar1] = -0.35667497;
      }
      uVar3 = uVar3 + 1;
      pfVar4 = pfVar4 + uVar2;
    } while (uVar3 != (uint)(W * H));
  }
  return;
}

Assistant:

void unariesFromLabelling(const int *inputLabelling, float *outputUnary, int W, int H, int dim) {
    const float GT_PROB = 0.7;
    const float u_energy = log(1.0 / dim);
    const float n_energy = log((1.0 - GT_PROB) / (dim - 1));
    const float p_energy = log(GT_PROB);

    for (int i = 0; i < W*H; i++) {
        if (inputLabelling[i] >= 0) {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = n_energy;
            }
            outputUnary[i*dim + inputLabelling[i]] = p_energy;
        }
        else {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = u_energy;
            }
        }
    }
}